

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cpp
# Opt level: O0

compressed_lower_distance_matrix * read_distance_matrix(istream *input_stream)

{
  undefined1 uVar1;
  istream *this;
  long *plVar2;
  istream *in_RSI;
  compressed_lower_distance_matrix *in_RDI;
  int j;
  istringstream s;
  int i;
  value_t value;
  string line;
  vector<float,_std::allocator<float>_> distances;
  undefined6 in_stack_fffffffffffffdf8;
  bool bVar3;
  int local_1e4;
  istringstream local_1e0 [8];
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffe28;
  compressed_distance_matrix<(compressed_matrix_layout)0> *in_stack_fffffffffffffe30;
  int local_50;
  float local_4c;
  string local_48 [56];
  istream *local_10;
  
  local_10 = in_RSI;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x14b1d1);
  std::__cxx11::string::string(local_48);
  local_50 = 0;
  while( true ) {
    this = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_10,local_48);
    uVar1 = std::ios::operator_cast_to_bool((ios *)(this + *(long *)(*(long *)this + -0x18)));
    if (!(bool)uVar1) break;
    std::__cxx11::istringstream::istringstream(local_1e0,local_48,_S_in);
    local_1e4 = 0;
    while( true ) {
      bVar3 = false;
      if (local_1e4 < local_50) {
        plVar2 = (long *)std::istream::operator>>((istream *)local_1e0,&local_4c);
        bVar3 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
      }
      if (bVar3 == false) break;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)this,
                 (value_type_conflict1 *)CONCAT17(uVar1,CONCAT16(bVar3,in_stack_fffffffffffffdf8)));
      std::istream::ignore();
      local_1e4 = local_1e4 + 1;
    }
    std::__cxx11::istringstream::~istringstream(local_1e0);
    local_50 = local_50 + 1;
  }
  compressed_distance_matrix<(compressed_matrix_layout)0>::compressed_distance_matrix
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  std::__cxx11::string::~string(local_48);
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)this)
  ;
  return in_RDI;
}

Assistant:

compressed_lower_distance_matrix read_distance_matrix(std::istream& input_stream) {
	std::vector<value_t> distances;

	std::string line;
	value_t value;
	for (int i = 0; std::getline(input_stream, line); ++i) {
		std::istringstream s(line);
		for (int j = 0; j < i && s >> value; ++j) {
			distances.push_back(value);
			s.ignore();
		}
	}

	return compressed_lower_distance_matrix(std::move(distances));
}